

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O3

void deqp::egl::Image::initializeColorRbo(Functions *gl,GLuint rbo,Texture2D *ref)

{
  undefined4 uVar1;
  undefined4 uVar2;
  GLenum GVar3;
  int iVar4;
  undefined8 extraout_RAX;
  undefined8 uVar5;
  undefined8 extraout_RAX_00;
  Vec4 *color;
  long lVar6;
  int width;
  int height;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  PixelBufferAccess local_58;
  
  if (initializeColorRbo(glw::Functions_const&,unsigned_int,tcu::Texture2D&)::colorValues == '\0') {
    initializeColorRbo();
  }
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,rbo);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,
                  "framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x1b9);
  (*gl->clearColor)(1.0,1.0,0.0,1.0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"clearColor(1.0f, 1.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x1ba);
  (*gl->clear)(0x4000);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"clear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x1bb);
  local_58.super_ConstPixelBufferAccess.m_format.order = 0x3f800000;
  local_58.super_ConstPixelBufferAccess.m_format.type = 0x3f800000;
  local_58.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  local_58.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
  tcu::clear((ref->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&local_58);
  (*gl->enable)(0xc11);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"enable(GL_SCISSOR_TEST)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x1bf);
  lVar6 = 6;
  color = initializeColorRbo::colorValues;
  uVar5 = extraout_RAX;
  do {
    uVar1 = ref->m_width;
    uVar2 = ref->m_height;
    auVar7._0_4_ = (float)(int)uVar1;
    auVar7._4_4_ = (float)(int)uVar2;
    auVar7._8_8_ = 0;
    auVar7 = divps(auVar7,_DAT_01ba5d40);
    width = (int)((float)(int)lVar6 * auVar7._0_4_);
    height = (int)((float)(int)lVar6 * auVar7._4_4_);
    auVar8._0_4_ = -(uint)(width == 0);
    auVar8._4_4_ = -(uint)(width == 0);
    auVar8._8_4_ = -(uint)(height == 0);
    auVar8._12_4_ = -(uint)(height == 0);
    iVar4 = movmskpd((int)uVar5,auVar8);
    if (iVar4 != 0) break;
    (*gl->scissor)(0,0,width,height);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"scissor(0, 0, size.x(), size.y())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x1c8);
    (*gl->clearColor)(color->m_data[0],color->m_data[1],color->m_data[2],color->m_data[3]);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,
                    "clearColor(colorValues[ndx].x(), colorValues[ndx].y(), colorValues[ndx].z(), colorValues[ndx].w())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x1c9);
    (*gl->clear)(0x4000);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"clear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x1ca);
    tcu::getSubregion(&local_58,
                      (ref->super_TextureLevelPyramid).m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start,0,0,width,height);
    tcu::clear(&local_58,color);
    color = color + 1;
    lVar6 = lVar6 + -1;
    uVar5 = extraout_RAX_00;
  } while (lVar6 != 0);
  (*gl->disable)(0xc11);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"disable(GL_SCISSOR_TEST)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x1cf);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,
                  "framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, 0)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x1d1);
  return;
}

Assistant:

void initializeColorRbo(const glw::Functions& gl, GLuint rbo, Texture2D& ref)
{
	static const tcu::Vec4 colorValues[] =
	{
		tcu::Vec4(0.9f, 0.5f, 0.65f, 1.0f),
		tcu::Vec4(0.5f, 0.7f, 0.65f, 1.0f),
		tcu::Vec4(0.2f, 0.5f, 0.65f, 1.0f),
		tcu::Vec4(0.3f, 0.1f, 0.5f, 1.0f),
		tcu::Vec4(0.8f, 0.2f, 0.3f, 1.0f),
		tcu::Vec4(0.9f, 0.4f, 0.8f, 1.0f),
	};

	GLU_CHECK_GLW_CALL(gl, framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
												   GL_RENDERBUFFER, rbo));
	GLU_CHECK_GLW_CALL(gl, clearColor(1.0f, 1.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(gl, clear(GL_COLOR_BUFFER_BIT));
	tcu::clear(ref.getLevel(0), Vec4(1.0f, 1.0f, 0.0f, 1.0f));

	// create a pattern
	GLU_CHECK_GLW_CALL(gl, enable(GL_SCISSOR_TEST));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(colorValues); ++ndx)
	{
		const tcu::IVec2	size	= tcu::IVec2((int)((float)(DE_LENGTH_OF_ARRAY(colorValues) - ndx) * ((float)ref.getWidth() / float(DE_LENGTH_OF_ARRAY(colorValues)))),
												 (int)((float)(DE_LENGTH_OF_ARRAY(colorValues) - ndx) * ((float)ref.getHeight() / float(DE_LENGTH_OF_ARRAY(colorValues) + 4)))); // not symmetric

		if (size.x() == 0 || size.y() == 0)
			break;

		GLU_CHECK_GLW_CALL(gl, scissor(0, 0, size.x(), size.y()));
		GLU_CHECK_GLW_CALL(gl, clearColor(colorValues[ndx].x(), colorValues[ndx].y(), colorValues[ndx].z(), colorValues[ndx].w()));
		GLU_CHECK_GLW_CALL(gl, clear(GL_COLOR_BUFFER_BIT));

		tcu::clear(tcu::getSubregion(ref.getLevel(0), 0, 0, size.x(), size.y()), colorValues[ndx]);
	}

	GLU_CHECK_GLW_CALL(gl, disable(GL_SCISSOR_TEST));
	GLU_CHECK_GLW_CALL(gl, framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
												   GL_RENDERBUFFER, 0));
}